

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O0

void __thiscall
msgpack::v2::detail::create_object_visitor::create_object_visitor
          (create_object_visitor *this,unpack_reference_func f,void *user_data,unpack_limit *limit)

{
  value_type poVar1;
  value_type poVar2;
  value_type poVar3;
  value_type poVar4;
  value_type poVar5;
  undefined8 *in_RCX;
  value_type in_RDX;
  vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_> *in_RSI;
  value_type *in_RDI;
  vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_> *this_00;
  
  *in_RDI = (value_type)in_RSI;
  in_RDI[1] = in_RDX;
  poVar1 = (value_type)*in_RCX;
  poVar2 = (value_type)in_RCX[1];
  poVar3 = (value_type)in_RCX[2];
  poVar4 = (value_type)in_RCX[3];
  poVar5 = (value_type)in_RCX[5];
  in_RDI[6] = (value_type)in_RCX[4];
  in_RDI[7] = poVar5;
  in_RDI[4] = poVar3;
  in_RDI[5] = poVar4;
  in_RDI[2] = poVar1;
  in_RDI[3] = poVar2;
  object::object((object *)0x1ddc17);
  this_00 = (vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_> *)(in_RDI + 0xb);
  std::vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>::vector
            ((vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_> *)0x1ddc29);
  std::vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>::reserve
            (in_RSI,(size_type)in_RDX);
  std::vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>::push_back
            (this_00,in_RDI);
  return;
}

Assistant:

create_object_visitor(unpack_reference_func f, void* user_data, unpack_limit const& limit)
        :m_func(f), m_user_data(user_data), m_limit(limit) {
        m_stack.reserve(MSGPACK_EMBED_STACK_SIZE);
        m_stack.push_back(&m_obj);
    }